

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

int yaml_parser_fetch_tag(yaml_parser_t *parser)

{
  size_t *psVar1;
  yaml_token_t **tail;
  byte bVar2;
  size_t sVar3;
  size_t sVar4;
  byte *pbVar5;
  size_t sVar6;
  yaml_mark_t start_mark_00;
  yaml_mark_t start_mark_01;
  yaml_mark_t start_mark_02;
  yaml_mark_t start_mark_03;
  undefined4 uVar7;
  int iVar8;
  yaml_char_t *tmp;
  size_t sVar9;
  yaml_char_t *pyVar10;
  char *pcVar11;
  long lVar12;
  yaml_token_t *pyVar13;
  yaml_token_t *pyVar14;
  long lVar15;
  byte bVar16;
  yaml_char_t *suffix;
  yaml_char_t *handle;
  yaml_mark_t start_mark;
  yaml_token_t token;
  yaml_char_t *local_98;
  yaml_char_t *local_90;
  size_t local_88;
  size_t sStack_80;
  size_t local_78;
  yaml_token_t local_68;
  
  bVar16 = 0;
  iVar8 = yaml_parser_save_simple_key(parser);
  if (iVar8 == 0) {
    return 0;
  }
  parser->simple_key_allowed = 0;
  local_90 = (yaml_char_t *)0x0;
  local_98 = (yaml_char_t *)0x0;
  local_78 = (parser->mark).column;
  local_88 = (parser->mark).index;
  sStack_80 = (parser->mark).line;
  if ((parser->unread < 2) && (iVar8 = yaml_parser_update_buffer(parser,2), iVar8 == 0))
  goto LAB_001124f3;
  if ((parser->buffer).pointer[1] == '<') {
    lVar15 = 1;
    local_90 = (yaml_char_t *)yaml_malloc(1);
    if (local_90 == (yaml_char_t *)0x0) goto LAB_001124f3;
    *local_90 = '\0';
    sVar3 = (parser->mark).index;
    (parser->mark).index = sVar3 + 1;
    sVar4 = (parser->mark).column;
    (parser->mark).column = sVar4 + 1;
    pbVar5 = (parser->buffer).pointer;
    sVar6 = parser->unread;
    parser->unread = sVar6 - 1;
    bVar2 = *pbVar5;
    if ((((char)bVar2 < '\0') && (lVar15 = 2, (bVar2 & 0xe0) != 0xc0)) &&
       (lVar15 = 3, (bVar2 & 0xf0) != 0xe0)) {
      lVar15 = (ulong)((bVar2 & 0xf8) == 0xf0) << 2;
    }
    (parser->buffer).pointer = pbVar5 + lVar15;
    (parser->mark).index = sVar3 + 2;
    (parser->mark).column = sVar4 + 2;
    parser->unread = sVar6 - 2;
    bVar2 = pbVar5[lVar15];
    lVar12 = 1;
    if ((((char)bVar2 < '\0') && (lVar12 = 2, (bVar2 & 0xe0) != 0xc0)) &&
       (lVar12 = 3, (bVar2 & 0xf0) != 0xe0)) {
      lVar12 = (ulong)((bVar2 & 0xf8) == 0xf0) << 2;
    }
    (parser->buffer).pointer = pbVar5 + lVar15 + lVar12;
    start_mark_00.line = sStack_80;
    start_mark_00.index = local_88;
    start_mark_00.column = local_78;
    iVar8 = yaml_parser_scan_tag_uri(parser,0,(yaml_char_t *)0x0,start_mark_00,&local_98);
    if (iVar8 == 0) goto LAB_001124f3;
    pbVar5 = (parser->buffer).pointer;
    if (*pbVar5 == 0x3e) {
      (parser->mark).index = (parser->mark).index + 1;
      psVar1 = &(parser->mark).column;
      *psVar1 = *psVar1 + 1;
      parser->unread = parser->unread - 1;
      bVar2 = *pbVar5;
      lVar15 = 1;
      if ((((char)bVar2 < '\0') && (lVar15 = 2, (bVar2 & 0xe0) != 0xc0)) &&
         (lVar15 = 3, (bVar2 & 0xf0) != 0xe0)) {
        lVar15 = (ulong)((bVar2 & 0xf8) == 0xf0) << 2;
      }
      (parser->buffer).pointer = pbVar5 + lVar15;
      goto LAB_00112337;
    }
    pcVar11 = "did not find the expected \'>\'";
  }
  else {
    start_mark_01.line = sStack_80;
    start_mark_01.index = local_88;
    start_mark_01.column = local_78;
    iVar8 = yaml_parser_scan_tag_handle(parser,0,start_mark_01,&local_90);
    pyVar10 = local_90;
    if (iVar8 == 0) goto LAB_001124f3;
    if (((*local_90 == '!') && (local_90[1] != '\0')) &&
       (sVar9 = strlen((char *)local_90), pyVar10[sVar9 - 1] == '!')) {
      start_mark_02.line = sStack_80;
      start_mark_02.index = local_88;
      start_mark_02.column = local_78;
      iVar8 = yaml_parser_scan_tag_uri(parser,0,(yaml_char_t *)0x0,start_mark_02,&local_98);
      if (iVar8 == 0) goto LAB_001124f3;
    }
    else {
      start_mark_03.line = sStack_80;
      start_mark_03.index = local_88;
      start_mark_03.column = local_78;
      iVar8 = yaml_parser_scan_tag_uri(parser,0,pyVar10,start_mark_03,&local_98);
      if (iVar8 == 0) goto LAB_001124f3;
      yaml_free(pyVar10);
      pyVar10 = (yaml_char_t *)yaml_malloc(2);
      local_90 = pyVar10;
      if (pyVar10 == (yaml_char_t *)0x0) goto LAB_001124f3;
      pyVar10[0] = '!';
      pyVar10[1] = '\0';
      if (*local_98 == '\0') {
        local_90 = local_98;
        local_98 = pyVar10;
      }
    }
LAB_00112337:
    if ((parser->unread == 0) && (iVar8 = yaml_parser_update_buffer(parser,1), iVar8 == 0))
    goto LAB_001124f3;
    pbVar5 = (parser->buffer).pointer;
    bVar2 = *pbVar5;
    if (((ulong)bVar2 < 0x21) && ((0x100002601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
LAB_0011237e:
      local_68.data._16_8_ = 0;
      local_68.type = YAML_TAG_TOKEN;
      local_68._4_4_ = 0;
      local_68.start_mark.index = local_88;
      local_68.start_mark.line = sStack_80;
      local_68.start_mark.column = local_78;
      local_68.end_mark.index = (parser->mark).index;
      local_68.end_mark.line = (parser->mark).line;
      local_68.end_mark.column = (parser->mark).column;
      local_68.data.tag.handle = local_90;
      local_68.data.tag.suffix = local_98;
      tail = &(parser->tokens).tail;
      if (((parser->tokens).tail == (parser->tokens).end) &&
         (iVar8 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,tail,
                                    &(parser->tokens).end), iVar8 == 0)) {
        parser->error = YAML_MEMORY_ERROR;
        yaml_token_delete(&local_68);
        return 0;
      }
      pyVar14 = *tail;
      *tail = pyVar14 + 1;
      pyVar13 = &local_68;
      for (lVar15 = 10; lVar15 != 0; lVar15 = lVar15 + -1) {
        uVar7 = *(undefined4 *)&pyVar13->field_0x4;
        pyVar14->type = pyVar13->type;
        *(undefined4 *)&pyVar14->field_0x4 = uVar7;
        pyVar13 = (yaml_token_t *)((long)pyVar13 + ((ulong)bVar16 * -2 + 1) * 8);
        pyVar14 = (yaml_token_t *)((long)pyVar14 + (ulong)bVar16 * -0x10 + 8);
      }
      return 1;
    }
    pcVar11 = "did not find expected whitespace or line break";
    if (bVar2 == 0xe2) {
      if ((pbVar5[1] == 0x80) && (pbVar5[2] == 0xa8)) goto LAB_0011237e;
    }
    else if ((bVar2 == 0xc2) && (pbVar5[1] == 0x85)) goto LAB_0011237e;
  }
  parser->error = YAML_SCANNER_ERROR;
  parser->context = "while scanning a tag";
  (parser->context_mark).index = local_88;
  (parser->context_mark).line = sStack_80;
  (parser->context_mark).column = local_78;
  parser->problem = pcVar11;
  sVar3 = (parser->mark).line;
  (parser->problem_mark).index = (parser->mark).index;
  (parser->problem_mark).line = sVar3;
  (parser->problem_mark).column = (parser->mark).column;
LAB_001124f3:
  yaml_free(local_90);
  yaml_free(local_98);
  return 0;
}

Assistant:

static int
yaml_parser_fetch_tag(yaml_parser_t *parser)
{
    yaml_token_t token;

    /* A tag could be a simple key. */

    if (!yaml_parser_save_simple_key(parser))
        return 0;

    /* A simple key cannot follow a tag. */

    parser->simple_key_allowed = 0;

    /* Create the TAG token and append it to the queue. */

    if (!yaml_parser_scan_tag(parser, &token))
        return 0;

    if (!ENQUEUE(parser, parser->tokens, token)) {
        yaml_token_delete(&token);
        return 0;
    }

    return 1;
}